

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O3

void __thiscall miniros::MasterLink::update(MasterLink *this,string *key,RpcValue *v)

{
  int iVar1;
  iterator iVar2;
  mapped_type *this_00;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  mutex *__mutex;
  string clean_key;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  if (this->internal_ != (Internal *)0x0) {
    names::clean(&clean_key,key);
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (update::loc.initialized_ == false) {
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"miniros.master_link","");
      plVar3 = (long *)std::__cxx11::string::append((char *)local_48);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_78 = *plVar4;
        lStack_70 = plVar3[3];
        local_88 = &local_78;
      }
      else {
        local_78 = *plVar4;
        local_88 = (long *)*plVar3;
      }
      local_80 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_88);
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_68.field_2._M_allocated_capacity = *psVar5;
        local_68.field_2._8_8_ = plVar3[3];
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar5;
        local_68._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_68._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      console::initializeLogLocation(&update::loc,&local_68,Debug);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,local_78 + 1);
      }
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
    if (update::loc.level_ != Debug) {
      console::setLogLocationLevel(&update::loc,Debug);
      console::checkLogLocationEnabled(&update::loc);
    }
    if (update::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,update::loc.logger_,update::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                     ,0x3cb,
                     "void miniros::MasterLink::update(const std::string &, const RpcValue &)",
                     "Received parameter update for key [%s]",clean_key._M_dataplus._M_p);
    }
    __mutex = &this->internal_->params_mutex;
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->internal_->subscribed_params)._M_t,&clean_key);
    if ((_Rb_tree_header *)iVar2._M_node !=
        &(this->internal_->subscribed_params)._M_t._M_impl.super__Rb_tree_header) {
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_XmlRpc::XmlRpcValue>_>_>
                ::operator[](&this->internal_->params,&clean_key);
      XmlRpc::XmlRpcValue::operator=(this_00,v);
    }
    invalidateParentParams(this,&clean_key);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)clean_key._M_dataplus._M_p != &clean_key.field_2) {
      operator_delete(clean_key._M_dataplus._M_p,clean_key.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void MasterLink::update(const std::string& key, const RpcValue& v)
{
  if (!internal_)
    return;
  std::string clean_key = names::clean(key);
  MINIROS_DEBUG_NAMED("cached_parameters", "Received parameter update for key [%s]", clean_key.c_str());

  std::scoped_lock<std::mutex> lock(internal_->params_mutex);

  if (internal_->subscribed_params.find(clean_key) != internal_->subscribed_params.end()) {
    internal_->params[clean_key] = v;
  }
  invalidateParentParams(clean_key);
}